

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O1

void __thiscall ev3dev::nxt_motor::nxt_motor(nxt_motor *this,address_type *address)

{
  pointer pcVar1;
  size_t sVar2;
  motor_type local_60;
  address_type local_40;
  
  pcVar1 = (address->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + address->_M_string_length);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  sVar2 = strlen(motor::motor_nxt);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,motor::motor_nxt,motor::motor_nxt + sVar2);
  motor::motor(&this->super_motor,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

nxt_motor::nxt_motor(address_type address)
    : motor(address, motor_nxt)
{ }